

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_cluster_on_connect(intptr_t uuid,void *udata)

{
  channel_s *pcVar1;
  fio_match_fn p_Var2;
  fio_str_info_s ch;
  fio_str_info_s ch_00;
  fio_str_info_s data;
  fio_str_info_s data_00;
  fio_msg_internal_s *pfVar3;
  uintptr_t uVar4;
  fio_protocol_s *protocol_;
  fio_ch_set__ordered_s_ *pfVar5;
  undefined8 unaff_RBX;
  uint32_t uVar6;
  char *unaff_R14;
  fio_ch_set__ordered_s_ *pfVar7;
  fio_lock_i ret;
  uint7 uStack_27;
  long in_stack_ffffffffffffffe0;
  
  LOCK();
  UNLOCK();
  cluster_data.uuid = uuid;
  if (fio_postoffice.pubsub.lock != '\0') {
    do {
      fio_postoffice.pubsub.lock = '\x01';
      ret = '\0';
      uStack_27 = 0;
      in_stack_ffffffffffffffe0 = 1;
      nanosleep((timespec *)&ret,(timespec *)0x0);
      LOCK();
      UNLOCK();
    } while (fio_postoffice.pubsub.lock != '\0');
  }
  fio_postoffice.pubsub.lock = '\x01';
  if ((fio_postoffice.pubsub.channels.ordered != (fio_ch_set__ordered_s_ *)0x0) &&
     (uVar4 = fio_postoffice.pubsub.channels.pos, pfVar5 = fio_postoffice.pubsub.channels.ordered,
     pfVar7 = fio_postoffice.pubsub.channels.ordered, 0 < (long)fio_postoffice.pubsub.channels.pos))
  {
    do {
      if ((pfVar7->hash != 0) &&
         ((((fio_data->is_worker != '\0' && (pcVar1 = pfVar7->obj, pcVar1 != (channel_s *)0x0)) &&
           (fio_data->workers != 1)) && (cluster_data.uuid != 0)))) {
        ret = '\0';
        uStack_27 = 0;
        p_Var2 = pcVar1->match;
        if (p_Var2 == (fio_match_fn)0x0) {
          uVar6 = 4;
        }
        else {
          uStack_27 = (uint7)((ushort)((ulong)p_Var2 >> 0x30) & 0xff) |
                      (uint7)((uint)((ulong)p_Var2 >> 0x20) & 0xff00) |
                      ((uint7)((ulong)p_Var2 >> 8) & 0xff000000) >> 8 | (uint7)p_Var2 & 0xff000000 |
                      (uint7)((((ulong)p_Var2 & 0xff0000) << 0x18) >> 8) |
                      (uint7)((((ulong)p_Var2 & 0xff00) << 0x28) >> 8) |
                      (uint7)((ulong)((long)p_Var2 << 0x38) >> 8);
          ret = (fio_lock_i)((ulong)p_Var2 >> 0x38);
          uVar6 = 6;
        }
        ch.data._0_1_ = ret;
        ch.capa = SUB168(ZEXT816(1) << 0x40,0);
        ch.len = SUB168(ZEXT816(1) << 0x40,8);
        ch.data._1_7_ = uStack_27;
        data.len = unaff_RBX;
        data.capa = in_stack_ffffffffffffffe0;
        data.data = unaff_R14;
        pfVar3 = fio_msg_internal_create
                           (0,uVar6,ch,data,(int8_t)pcVar1->name_len,(int8_t)pcVar1->name);
        fio_cluster_client_sender(pfVar3,-1);
        uVar4 = fio_postoffice.pubsub.channels.pos;
        pfVar5 = fio_postoffice.pubsub.channels.ordered;
      }
      pfVar7 = pfVar7 + 1;
    } while (pfVar7 < pfVar5 + uVar4);
  }
  LOCK();
  fio_postoffice.pubsub.lock = '\0';
  UNLOCK();
  LOCK();
  UNLOCK();
  uVar4 = fio_postoffice.patterns.channels.pos;
  pfVar5 = fio_postoffice.patterns.channels.ordered;
  while (fio_postoffice.patterns.channels.pos = uVar4,
        fio_postoffice.patterns.channels.ordered = pfVar5, fio_postoffice.patterns.lock != '\0') {
    fio_postoffice.patterns.lock = '\x01';
    ret = '\0';
    uStack_27 = 0;
    in_stack_ffffffffffffffe0 = 1;
    nanosleep((timespec *)&ret,(timespec *)0x0);
    LOCK();
    UNLOCK();
    uVar4 = fio_postoffice.patterns.channels.pos;
    pfVar5 = fio_postoffice.patterns.channels.ordered;
  }
  fio_postoffice.patterns.lock = '\x01';
  if ((pfVar5 != (fio_ch_set__ordered_s_ *)0x0) && (pfVar7 = pfVar5, 0 < (long)uVar4)) {
    do {
      if ((((pfVar7->hash != 0) &&
           ((fio_data->is_worker != '\0' && (pcVar1 = pfVar7->obj, pcVar1 != (channel_s *)0x0)))) &&
          (fio_data->workers != 1)) && (cluster_data.uuid != 0)) {
        ret = '\0';
        uStack_27 = 0;
        p_Var2 = pcVar1->match;
        if (p_Var2 == (fio_match_fn)0x0) {
          uVar6 = 4;
        }
        else {
          uStack_27 = (uint7)((ushort)((ulong)p_Var2 >> 0x30) & 0xff) |
                      (uint7)((uint)((ulong)p_Var2 >> 0x20) & 0xff00) |
                      ((uint7)((ulong)p_Var2 >> 8) & 0xff000000) >> 8 | (uint7)p_Var2 & 0xff000000 |
                      (uint7)((((ulong)p_Var2 & 0xff0000) << 0x18) >> 8) |
                      (uint7)((((ulong)p_Var2 & 0xff00) << 0x28) >> 8) |
                      (uint7)((ulong)((long)p_Var2 << 0x38) >> 8);
          ret = (fio_lock_i)((ulong)p_Var2 >> 0x38);
          uVar6 = 6;
        }
        ch_00.data._0_1_ = ret;
        ch_00.capa = SUB168(ZEXT816(1) << 0x40,0);
        ch_00.len = SUB168(ZEXT816(1) << 0x40,8);
        ch_00.data._1_7_ = uStack_27;
        data_00.len = unaff_RBX;
        data_00.capa = in_stack_ffffffffffffffe0;
        data_00.data = unaff_R14;
        pfVar3 = fio_msg_internal_create
                           (0,uVar6,ch_00,data_00,(int8_t)pcVar1->name_len,(int8_t)pcVar1->name);
        fio_cluster_client_sender(pfVar3,-1);
        uVar4 = fio_postoffice.patterns.channels.pos;
        pfVar5 = fio_postoffice.patterns.channels.ordered;
      }
      pfVar7 = pfVar7 + 1;
    } while (pfVar7 < pfVar5 + uVar4);
  }
  ret = fio_postoffice.patterns.lock;
  LOCK();
  fio_postoffice.patterns.lock = '\0';
  UNLOCK();
  protocol_ = fio_cluster_protocol_alloc(uuid,fio_cluster_client_handler,fio_cluster_client_sender);
  fio_attach__internal((void *)uuid,protocol_);
  return;
}

Assistant:

static void fio_cluster_on_connect(intptr_t uuid, void *udata) {
  cluster_data.uuid = uuid;

  /* inform root about all existing channels */
  fio_lock(&fio_postoffice.pubsub.lock);
  FIO_SET_FOR_LOOP(&fio_postoffice.pubsub.channels, pos) {
    if (!pos->hash) {
      continue;
    }
    fio_cluster_inform_root_about_channel(pos->obj, 1);
  }
  fio_unlock(&fio_postoffice.pubsub.lock);
  fio_lock(&fio_postoffice.patterns.lock);
  FIO_SET_FOR_LOOP(&fio_postoffice.patterns.channels, pos) {
    if (!pos->hash) {
      continue;
    }
    fio_cluster_inform_root_about_channel(pos->obj, 1);
  }
  fio_unlock(&fio_postoffice.patterns.lock);

  fio_attach(uuid, fio_cluster_protocol_alloc(uuid, fio_cluster_client_handler,
                                              fio_cluster_client_sender));
  (void)udata;
}